

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O3

bool __thiscall
CServerBrowserFavorites::RemoveFavoriteEx
          (CServerBrowserFavorites *this,char *pHostname,NETADDR *pAddr)

{
  int iVar1;
  CServerBrowserFavorites *b;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  int Index;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  if (0 < this->m_NumFavoriteServers) {
    lVar3 = 0;
    b = this;
    do {
      iVar1 = str_comp(pHostname,(char *)b);
      if (iVar1 == 0) {
        local_3c = (int)lVar3;
        goto LAB_0012c333;
      }
      lVar3 = lVar3 + 1;
      b = (CServerBrowserFavorites *)(b->m_aFavoriteServers + 1);
    } while (lVar3 < this->m_NumFavoriteServers);
  }
  if ((pAddr == (NETADDR *)0x0) ||
     (b = (CServerBrowserFavorites *)FindFavoriteByAddr(this,pAddr,&local_3c),
     b == (CServerBrowserFavorites *)0x0)) {
    bVar2 = false;
  }
  else {
LAB_0012c333:
    iVar1 = b->m_aFavoriteServers[0].m_State;
    bVar2 = 2 < iVar1;
    if ((iVar1 < 3) && ((iVar1 != 2 && ((this->m_FavLookup).m_FavoriteIndex == local_3c)))) {
      (this->m_FavLookup).m_FavoriteIndex = -1;
    }
    mem_move(this->m_aFavoriteServers + local_3c,this->m_aFavoriteServers + (local_3c + 1),
             (this->m_NumFavoriteServers - (local_3c + 1)) * 0xbc);
    this->m_NumFavoriteServers = this->m_NumFavoriteServers + -1;
    iVar1 = (this->m_FavLookup).m_FavoriteIndex;
    if (local_3c < iVar1) {
      (this->m_FavLookup).m_FavoriteIndex = iVar1 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CServerBrowserFavorites::RemoveFavoriteEx(const char *pHostname, const NETADDR *pAddr)
{
	bool Result = false;

	// find favorite entry
	int Index = 0;
	CFavoriteServer *pFavEntry = FindFavoriteByHostname(pHostname, &Index);
	if(pFavEntry == 0 && pAddr)
		pFavEntry = FindFavoriteByAddr(*pAddr, &Index);
	if(pFavEntry)
	{
		if(pFavEntry->m_State >= FAVSTATE_ADDR)
		{
			// invalidate favorite state for server entry
			Result = true;
		}
		else if(pFavEntry->m_State <= FAVSTATE_LOOKUPCHECK && m_FavLookup.m_FavoriteIndex == Index)
		{
			// skip result on favorite hostname lookup
			m_FavLookup.m_FavoriteIndex = -1;
		}

		// remove favorite
		RemoveFavoriteEntry(Index);
		if(m_FavLookup.m_FavoriteIndex > Index)
			--m_FavLookup.m_FavoriteIndex;
	}

	return Result;
}